

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_MultipleMemTables::_Run(_Test_MultipleMemTables *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  RecoveryTest *pRVar3;
  int iVar4;
  size_t sVar5;
  Tester *this_00;
  uint uVar6;
  ulong uVar7;
  uint64_t old_log_file;
  char buf [100];
  Options opt;
  undefined1 local_2f9;
  RecoveryTest *local_2f8;
  string local_2f0;
  Status local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined1 local_2b8 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_298 [4];
  Options local_230;
  Tester local_1d0;
  
  uVar7 = 0;
  local_2f8 = &this->super_RecoveryTest;
  do {
    snprintf((char *)local_298,100,"%050d",uVar7);
    local_1d0.ok_ = true;
    local_1d0.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
    ;
    local_1d0.line_ = 0xfa;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
    local_230.comparator = (Comparator *)&local_230.env;
    sVar5 = strlen((char *)local_298);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,local_298,
               (long)&local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start + sVar5);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    sVar5 = strlen((char *)local_298);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,local_298,
               (long)&local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start + sVar5);
    local_2f9 = 0;
    local_2b8._0_8_ = local_230.comparator;
    local_2b8[8] = local_230.create_if_missing;
    local_2b8[9] = local_230.error_if_exists;
    local_2b8[10] = local_230.paranoid_checks;
    local_2b8._11_5_ = local_230._11_5_;
    local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p;
    uStack_2c0 = (undefined4)local_2f0._M_string_length;
    uStack_2bc = local_2f0._M_string_length._4_4_;
    (*local_2f8->db_->_vptr_DB[2])(&local_2d0,local_2f8->db_,&local_2f9,local_2b8,&local_2c8);
    test::Tester::IsOk(&local_1d0,&local_2d0);
    if (local_2d0.state_ != (char *)0x0) {
      operator_delete__(local_2d0.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if (local_230.comparator != (Comparator *)&local_230.env) {
      operator_delete(local_230.comparator);
    }
    test::Tester::~Tester(&local_1d0);
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
  } while (uVar6 != 1000);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1d0.line_ = 0xfc;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  iVar4 = RecoveryTest::NumTables(local_2f8);
  local_230.comparator = (Comparator *)CONCAT44(local_230.comparator._4_4_,iVar4);
  test::Tester::IsEq<int,int>(&local_1d0,(int *)local_298,(int *)&local_230);
  test::Tester::~Tester(&local_1d0);
  if (local_2f8->db_ != (DB *)0x0) {
    (*local_2f8->db_->_vptr_DB[1])();
  }
  pRVar3 = local_2f8;
  local_2f8->db_ = (DB *)0x0;
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1d0.line_ = 0xfe;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  iVar4 = RecoveryTest::NumTables(pRVar3);
  local_230.comparator._0_4_ = iVar4;
  test::Tester::IsEq<int,int>(&local_1d0,(int *)local_298,(int *)&local_230);
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1d0.line_ = 0xff;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  iVar4 = RecoveryTest::NumLogs(local_2f8);
  local_230.comparator = (Comparator *)CONCAT44(local_230.comparator._4_4_,iVar4);
  test::Tester::IsEq<int,int>(&local_1d0,(int *)local_298,(int *)&local_230);
  test::Tester::~Tester(&local_1d0);
  pRVar3 = local_2f8;
  RecoveryTest::GetFiles
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d0,local_2f8,kLogFile)
  ;
  paVar1 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)CONCAT71(local_1d0._1_7_,local_1d0.ok_);
  operator_delete((undefined8 *)CONCAT71(local_1d0._1_7_,local_1d0.ok_));
  local_2c8 = paVar1;
  Options::Options(&local_230);
  local_230.reuse_logs = true;
  local_230.write_buffer_size = 50000;
  RecoveryTest::Open(pRVar3,&local_230);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1d0.line_ = 0x107;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  iVar4 = RecoveryTest::NumTables(pRVar3);
  local_2f0._M_dataplus._M_p._0_4_ = iVar4;
  test::Tester::IsLe<int,int>(&local_1d0,(int *)local_298,(int *)&local_2f0);
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1d0.line_ = 0x108;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  local_2f0._M_dataplus._M_p._0_4_ = RecoveryTest::NumLogs(local_2f8);
  test::Tester::IsEq<int,int>(&local_1d0,(int *)local_298,(int *)&local_2f0);
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1d0.line_ = 0x109;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  RecoveryTest::GetFiles(local_298,local_2f8,kLogFile);
  pcVar2 = *(pointer *)
            CONCAT44(local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_);
  operator_delete((undefined8 *)
                  CONCAT44(local_298[0].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           local_298[0].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_));
  local_2f0._M_dataplus._M_p = pcVar2;
  this_00 = test::Tester::IsNe<unsigned_long,unsigned_long>
                      (&local_1d0,(unsigned_long *)&local_2c8,(unsigned_long *)&local_2f0);
  test::Tester::operator<<(this_00,(char (*) [19])"must not reuse log");
  test::Tester::~Tester(&local_1d0);
  iVar4 = 0;
  do {
    snprintf((char *)local_298,100,"%050d");
    local_1d0.ok_ = true;
    local_1d0.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
    ;
    local_1d0.line_ = 0x10d;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
    local_2b8._0_8_ = local_2b8 + 0x10;
    sVar5 = strlen((char *)local_298);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b8,local_298,
               (long)&local_298[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start + sVar5);
    RecoveryTest::Get(&local_2f0,local_2f8,(string *)local_2b8,(Snapshot *)0x0);
    test::Tester::IsEq<char[100],std::__cxx11::string>
              (&local_1d0,(char (*) [100])local_298,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_);
    }
    test::Tester::~Tester(&local_1d0);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 1000);
  return;
}

Assistant:

TEST(RecoveryTest, MultipleMemTables) {
  // Make a large log.
  const int kNum = 1000;
  for (int i = 0; i < kNum; i++) {
    char buf[100];
    snprintf(buf, sizeof(buf), "%050d", i);
    ASSERT_OK(Put(buf, buf));
  }
  ASSERT_EQ(0, NumTables());
  Close();
  ASSERT_EQ(0, NumTables());
  ASSERT_EQ(1, NumLogs());
  uint64_t old_log_file = FirstLogFile();

  // Force creation of multiple memtables by reducing the write buffer size.
  Options opt;
  opt.reuse_logs = true;
  opt.write_buffer_size = (kNum * 100) / 2;
  Open(&opt);
  ASSERT_LE(2, NumTables());
  ASSERT_EQ(1, NumLogs());
  ASSERT_NE(old_log_file, FirstLogFile()) << "must not reuse log";
  for (int i = 0; i < kNum; i++) {
    char buf[100];
    snprintf(buf, sizeof(buf), "%050d", i);
    ASSERT_EQ(buf, Get(buf));
  }
}